

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void test_handshake(ptls_iovec_t ticket,int use_early_data)

{
  size_t sVar1;
  undefined8 uVar2;
  ptls_t *ppVar3;
  int iVar4;
  size_t sVar5;
  char *resp;
  char *req;
  ulong uStack_c0c8;
  int ret;
  size_t max_early_data_size;
  size_t consumed;
  ptls_buffer_t decbuf;
  ptls_buffer_t sbuf;
  ptls_buffer_t cbuf;
  uint8_t decbuf_small [16384];
  uint8_t sbuf_small [16384];
  uint8_t cbuf_small [16384];
  undefined1 local_50 [8];
  ptls_handshake_properties_t client_hs_prop;
  ptls_t *server;
  ptls_t *client;
  uint8_t *puStack_18;
  int use_early_data_local;
  ptls_iovec_t ticket_local;
  
  client_hs_prop.client.session_ticket.base = (uint8_t *)ticket.len;
  local_50 = (undefined1  [8])ticket.base;
  client_hs_prop.client.session_ticket.len = 0;
  client_hs_prop._16_1_ = client_hs_prop._16_1_ & 0xfe;
  uStack_c0c8 = 0;
  client._4_4_ = use_early_data;
  puStack_18 = (uint8_t *)local_50;
  ticket_local.base = client_hs_prop.client.session_ticket.base;
  server = ptls_new(ctx,"example.com");
  client_hs_prop._24_8_ = ptls_new(ctx_peer,(char *)0x0);
  ptls_buffer_init((ptls_buffer_t *)&sbuf.is_allocated,sbuf_small + 0x3ff8,0x4000);
  ptls_buffer_init((ptls_buffer_t *)&decbuf.is_allocated,decbuf_small + 0x3ff8,0x4000);
  ptls_buffer_init((ptls_buffer_t *)&consumed,&cbuf.is_allocated,0x4000);
  if (client._4_4_ != 0) {
    if (ctx_peer->max_early_data_size == 0) {
      __assert_fail("ctx_peer->max_early_data_size != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c"
                    ,0x8b,"void test_handshake(ptls_iovec_t, int)");
    }
    client_hs_prop.client.session_ticket.len = (size_t)&stack0xffffffffffff3f38;
  }
  iVar4 = ptls_handshake(server,(ptls_buffer_t *)&sbuf.is_allocated,(void *)0x0,(size_t *)0x0,
                         (ptls_handshake_properties_t *)local_50);
  _ok((uint)(iVar4 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0x8f);
  _ok((uint)(cbuf.capacity != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0x90);
  if (client._4_4_ != 0) {
    _ok((uint)(uStack_c0c8 == ctx_peer->max_early_data_size),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0x93);
    ppVar3 = server;
    sVar5 = strlen("GET / HTTP/1.0\r\n\r\n");
    iVar4 = ptls_send(ppVar3,(ptls_buffer_t *)&sbuf.is_allocated,"GET / HTTP/1.0\r\n\r\n",sVar5);
    _ok((uint)(iVar4 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0x95);
  }
  max_early_data_size = cbuf.capacity;
  iVar4 = ptls_handshake((ptls_t *)client_hs_prop._24_8_,(ptls_buffer_t *)&decbuf.is_allocated,
                         (void *)sbuf._24_8_,&max_early_data_size,(ptls_handshake_properties_t *)0x0
                        );
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0x9a);
  _ok((uint)(sbuf.capacity != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0x9b);
  if (client._4_4_ == 0) {
    _ok((uint)(max_early_data_size == cbuf.capacity),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xaf);
    cbuf.capacity = 0;
  }
  else {
    _ok((uint)(max_early_data_size < cbuf.capacity),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0x9e);
    memmove((void *)sbuf._24_8_,(void *)(sbuf._24_8_ + max_early_data_size),
            cbuf.capacity - max_early_data_size);
    max_early_data_size = cbuf.capacity - max_early_data_size;
    cbuf.capacity = max_early_data_size;
    iVar4 = ptls_receive((ptls_t *)client_hs_prop._24_8_,(ptls_buffer_t *)&consumed,
                         (void *)sbuf._24_8_,&max_early_data_size);
    _ok((uint)(iVar4 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xa4);
    _ok((uint)(max_early_data_size == cbuf.capacity),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xa5);
    sVar1 = decbuf.capacity;
    sVar5 = strlen("GET / HTTP/1.0\r\n\r\n");
    _ok((uint)(sVar1 == sVar5),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xa6);
    iVar4 = memcmp((void *)consumed,"GET / HTTP/1.0\r\n\r\n",decbuf.capacity);
    _ok((uint)(iVar4 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xa7);
    iVar4 = ptls_is_early_data((ptls_t *)client_hs_prop._24_8_);
    _ok(iVar4,"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xa8);
    uVar2 = client_hs_prop._24_8_;
    cbuf.capacity = 0;
    decbuf.capacity = 0;
    sVar5 = strlen("HTTP/1.0 200 OK\r\n\r\nhello world\n");
    iVar4 = ptls_send((ptls_t *)uVar2,(ptls_buffer_t *)&decbuf.is_allocated,
                      "HTTP/1.0 200 OK\r\n\r\nhello world\n",sVar5);
    _ok((uint)(iVar4 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xad);
  }
  max_early_data_size = sbuf.capacity;
  iVar4 = ptls_handshake(server,(ptls_buffer_t *)&sbuf.is_allocated,(void *)decbuf._24_8_,
                         &max_early_data_size,(ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0xb5);
  _ok((uint)(cbuf.capacity != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0xb6);
  if (client._4_4_ == 0) {
    _ok((uint)(max_early_data_size == sbuf.capacity),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xbd);
    ppVar3 = server;
    sbuf.capacity = 0;
    sVar5 = strlen("GET / HTTP/1.0\r\n\r\n");
    iVar4 = ptls_send(ppVar3,(ptls_buffer_t *)&sbuf.is_allocated,"GET / HTTP/1.0\r\n\r\n",sVar5);
    _ok((uint)(iVar4 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xc1);
    max_early_data_size = cbuf.capacity;
    iVar4 = ptls_receive((ptls_t *)client_hs_prop._24_8_,(ptls_buffer_t *)&consumed,
                         (void *)sbuf._24_8_,&max_early_data_size);
    _ok((uint)(iVar4 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xc5);
    _ok((uint)(max_early_data_size == cbuf.capacity),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xc6);
    sVar1 = decbuf.capacity;
    sVar5 = strlen("GET / HTTP/1.0\r\n\r\n");
    _ok((uint)(sVar1 == sVar5),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        199);
    sVar1 = consumed;
    sVar5 = strlen("GET / HTTP/1.0\r\n\r\n");
    iVar4 = memcmp((void *)sVar1,"GET / HTTP/1.0\r\n\r\n",sVar5);
    _ok((uint)(iVar4 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        200);
    iVar4 = ptls_is_early_data((ptls_t *)client_hs_prop._24_8_);
    _ok((uint)((iVar4 != 0 ^ 0xffU) & 1),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xc9);
    uVar2 = client_hs_prop._24_8_;
    decbuf.capacity = 0;
    sVar5 = strlen("HTTP/1.0 200 OK\r\n\r\nhello world\n");
    iVar4 = ptls_send((ptls_t *)uVar2,(ptls_buffer_t *)&decbuf.is_allocated,
                      "HTTP/1.0 200 OK\r\n\r\nhello world\n",sVar5);
    _ok((uint)(iVar4 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xcd);
  }
  else {
    _ok((uint)(max_early_data_size < sbuf.capacity),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xb9);
    memmove((void *)decbuf._24_8_,(void *)(decbuf._24_8_ + max_early_data_size),
            sbuf.capacity - max_early_data_size);
    sbuf.capacity = sbuf.capacity - max_early_data_size;
  }
  max_early_data_size = sbuf.capacity;
  iVar4 = ptls_receive(server,(ptls_buffer_t *)&consumed,(void *)decbuf._24_8_,&max_early_data_size)
  ;
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0xd2);
  _ok((uint)(max_early_data_size == sbuf.capacity),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0xd3);
  sVar1 = decbuf.capacity;
  sVar5 = strlen("HTTP/1.0 200 OK\r\n\r\nhello world\n");
  _ok((uint)(sVar1 == sVar5),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0xd4);
  sVar5 = strlen("HTTP/1.0 200 OK\r\n\r\nhello world\n");
  iVar4 = memcmp((void *)consumed,"HTTP/1.0 200 OK\r\n\r\nhello world\n",sVar5);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0xd5);
  iVar4 = ptls_is_early_data(server);
  _ok((uint)((iVar4 != 0 ^ 0xffU) & 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0xd6);
  decbuf.capacity = 0;
  if (client._4_4_ != 0) {
    max_early_data_size = cbuf.capacity;
    iVar4 = ptls_receive((ptls_t *)client_hs_prop._24_8_,(ptls_buffer_t *)&consumed,
                         (void *)sbuf._24_8_,&max_early_data_size);
    _ok((uint)(iVar4 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xdc);
    _ok((uint)(cbuf.capacity == max_early_data_size),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xdd);
    _ok((uint)(decbuf.capacity == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xde);
    iVar4 = ptls_is_early_data(server);
    _ok((uint)((iVar4 != 0 ^ 0xffU) & 1),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xdf);
  }
  ptls_buffer_dispose((ptls_buffer_t *)&sbuf.is_allocated);
  ptls_buffer_dispose((ptls_buffer_t *)&decbuf.is_allocated);
  ptls_buffer_dispose((ptls_buffer_t *)&consumed);
  ptls_free(server);
  ptls_free((ptls_t *)client_hs_prop._24_8_);
  return;
}

Assistant:

static void test_handshake(ptls_iovec_t ticket, int use_early_data)
{
    ptls_t *client, *server;
    ptls_handshake_properties_t client_hs_prop = {{ticket}};
    uint8_t cbuf_small[16384], sbuf_small[16384], decbuf_small[16384];
    ptls_buffer_t cbuf, sbuf, decbuf;
    size_t consumed, max_early_data_size = 0;
    int ret;
    const char *req = "GET / HTTP/1.0\r\n\r\n";
    const char *resp = "HTTP/1.0 200 OK\r\n\r\nhello world\n";

    client = ptls_new(ctx, "example.com");
    server = ptls_new(ctx_peer, NULL);
    ptls_buffer_init(&cbuf, cbuf_small, sizeof(cbuf_small));
    ptls_buffer_init(&sbuf, sbuf_small, sizeof(sbuf_small));
    ptls_buffer_init(&decbuf, decbuf_small, sizeof(decbuf_small));

    if (use_early_data) {
        assert(ctx_peer->max_early_data_size != 0);
        client_hs_prop.client.max_early_data_size = &max_early_data_size;
    }
    ret = ptls_handshake(client, &cbuf, NULL, NULL, &client_hs_prop);
    ok(ret == PTLS_ERROR_HANDSHAKE_IN_PROGRESS);
    ok(cbuf.off != 0);

    if (use_early_data) {
        ok(max_early_data_size == ctx_peer->max_early_data_size);
        ret = ptls_send(client, &cbuf, req, strlen(req));
        ok(ret == 0);
    }

    consumed = cbuf.off;
    ret = ptls_handshake(server, &sbuf, cbuf.base, &consumed, NULL);
    ok(ret == 0);
    ok(sbuf.off != 0);

    if (use_early_data) {
        ok(consumed < cbuf.off);
        memmove(cbuf.base, cbuf.base + consumed, cbuf.off - consumed);
        cbuf.off -= consumed;

        consumed = cbuf.off;
        ret = ptls_receive(server, &decbuf, cbuf.base, &consumed);
        ok(ret == 0);
        ok(consumed == cbuf.off);
        ok(decbuf.off == strlen(req));
        ok(memcmp(decbuf.base, req, decbuf.off) == 0);
        ok(ptls_is_early_data(server));
        cbuf.off = 0;
        decbuf.off = 0;

        ret = ptls_send(server, &sbuf, resp, strlen(resp));
        ok(ret == 0);
    } else {
        ok(consumed == cbuf.off);
        cbuf.off = 0;
    }

    consumed = sbuf.off;
    ret = ptls_handshake(client, &cbuf, sbuf.base, &consumed, NULL);
    ok(ret == 0);
    ok(cbuf.off != 0);

    if (use_early_data) {
        ok(consumed < sbuf.off);
        memmove(sbuf.base, sbuf.base + consumed, sbuf.off - consumed);
        sbuf.off -= consumed;
    } else {
        ok(consumed == sbuf.off);
        sbuf.off = 0;

        ret = ptls_send(client, &cbuf, req, strlen(req));
        ok(ret == 0);

        consumed = cbuf.off;
        ret = ptls_receive(server, &decbuf, cbuf.base, &consumed);
        ok(ret == 0);
        ok(consumed == cbuf.off);
        ok(decbuf.off == strlen(req));
        ok(memcmp(decbuf.base, req, strlen(req)) == 0);
        ok(!ptls_is_early_data(server));
        decbuf.off = 0;

        ret = ptls_send(server, &sbuf, resp, strlen(resp));
        ok(ret == 0);
    }

    consumed = sbuf.off;
    ret = ptls_receive(client, &decbuf, sbuf.base, &consumed);
    ok(ret == 0);
    ok(consumed == sbuf.off);
    ok(decbuf.off == strlen(resp));
    ok(memcmp(decbuf.base, resp, strlen(resp)) == 0);
    ok(!ptls_is_early_data(client));
    decbuf.off = 0;

    if (use_early_data) {
        consumed = cbuf.off;
        ret = ptls_receive(server, &decbuf, cbuf.base, &consumed);
        ok(ret == 0);
        ok(cbuf.off == consumed);
        ok(decbuf.off == 0);
        ok(!ptls_is_early_data(client));
    }

    ptls_buffer_dispose(&cbuf);
    ptls_buffer_dispose(&sbuf);
    ptls_buffer_dispose(&decbuf);
    ptls_free(client);
    ptls_free(server);
}